

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O3

void dummy_ProfiledNewScArray(void)

{
  return;
}

Assistant:

Var ProfilingHelpers::ProfiledNewScObjArray_Jit(
        const Var callee,
        void *const framePointer,
        const ProfileId profileId,
        const ProfileId arrayProfileId,
        CallInfo callInfo,
        ...)
    {
        ARGUMENTS(args, callee, framePointer, profileId, arrayProfileId, callInfo);
        ScriptFunction* func = UnsafeVarTo<ScriptFunction>(JavascriptCallStackLayout::FromFramePointer(framePointer)->functionObject);
        JIT_HELPER_REENTRANT_HEADER(ProfiledNewScObjArray);
        return
            ProfiledNewScObjArray(
                callee,
                args,
                func,
                profileId,
                arrayProfileId);
        JIT_HELPER_END(ProfiledNewScObjArray);
    }